

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_bounding_sphere(REF_NODE ref_node,REF_INT *nodes,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != 3; uVar2 = uVar2 + 1) {
    center[uVar2] = 0.0;
    dVar6 = 0.0;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = dVar6 + ref_node->real[(long)nodes[uVar4] * 0xf + (long)(int)uVar2];
      center[uVar2] = dVar6;
    }
    center[uVar2] = dVar6 / (double)n;
  }
  *radius = 0.0;
  dVar6 = 0.0;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pRVar1 = ref_node->real;
    lVar5 = (long)nodes[uVar2];
    dVar7 = SQRT((pRVar1[lVar5 * 0xf + 2] - center[2]) * (pRVar1[lVar5 * 0xf + 2] - center[2]) +
                 (pRVar1[lVar5 * 0xf + 1] - center[1]) * (pRVar1[lVar5 * 0xf + 1] - center[1]) +
                 (pRVar1[lVar5 * 0xf] - *center) * (pRVar1[lVar5 * 0xf] - *center));
    if (dVar6 <= dVar7) {
      dVar6 = dVar7;
    }
    *radius = dVar6;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere(REF_NODE ref_node, REF_INT *nodes,
                                            REF_INT n, REF_DBL *center,
                                            REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += ref_node_xyz(ref_node, i, nodes[j]);
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(
        *radius, sqrt(pow(ref_node_xyz(ref_node, 0, nodes[i]) - center[0], 2) +
                      pow(ref_node_xyz(ref_node, 1, nodes[i]) - center[1], 2) +
                      pow(ref_node_xyz(ref_node, 2, nodes[i]) - center[2], 2)));
  return REF_SUCCESS;
}